

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight.cpp
# Opt level: O0

void gl_ParsePulseLight(FScanner *sc)

{
  bool bVar1;
  int iVar2;
  FLightDefaults *pFVar3;
  FName local_38;
  FName local_34;
  FLightDefaults *pFStack_30;
  FName name;
  FLightDefaults *defaults;
  int intVal;
  float floatTriple [3];
  float floatVal;
  int type;
  FScanner *sc_local;
  
  FScanner::GetString(sc);
  FName::FName(&local_34,sc->String);
  FScanner::GetString(sc);
  bVar1 = FScanner::Compare(sc,"{");
  if (bVar1) {
    pFVar3 = (FLightDefaults *)operator_new(0x38);
    FName::FName(&local_38,&local_34);
    FLightDefaults::FLightDefaults(pFVar3,&local_38,PulseLight);
    ScriptDepth = ScriptDepth + 1;
    pFStack_30 = pFVar3;
    while (ScriptDepth != 0) {
      FScanner::GetString(sc);
      floatTriple[2] = (float)FScanner::MatchString(sc,LightTags,8);
      pFVar3 = pFStack_30;
      switch(floatTriple[2]) {
      case 0.0:
        gl_ParseTriple(sc,(float *)((long)&defaults + 4));
        pFVar3 = pFStack_30;
        iVar2 = clamp<int>((int)(defaults._4_4_ * 255.0),0,0xff);
        FLightDefaults::SetArg(pFVar3,0,(BYTE)iVar2);
        pFVar3 = pFStack_30;
        iVar2 = clamp<int>((int)((float)intVal * 255.0),0,0xff);
        FLightDefaults::SetArg(pFVar3,1,(BYTE)iVar2);
        pFVar3 = pFStack_30;
        iVar2 = clamp<int>((int)(floatTriple[0] * 255.0),0,0xff);
        FLightDefaults::SetArg(pFVar3,2,(BYTE)iVar2);
        break;
      case 1.4013e-45:
        iVar2 = gl_ParseInt(sc);
        defaults._0_4_ = clamp<int>(iVar2,0,0xff);
        FLightDefaults::SetArg(pFStack_30,3,(BYTE)(int)defaults);
        break;
      case 2.8026e-45:
        iVar2 = gl_ParseInt(sc);
        defaults._0_4_ = clamp<int>(iVar2,0,0xff);
        FLightDefaults::SetArg(pFStack_30,4,(BYTE)(int)defaults);
        break;
      case 4.2039e-45:
        gl_ParseTriple(sc,(float *)((long)&defaults + 4));
        FLightDefaults::SetOffset(pFStack_30,(float *)((long)&defaults + 4));
        break;
      default:
        FScanner::ScriptError(sc,"Unknown tag: %s\n",sc->String);
        break;
      case 7.00649e-45:
        floatTriple[1] = gl_ParseFloat(sc);
        FLightDefaults::SetParameter(pFStack_30,(double)(floatTriple[1] * 35.0));
        break;
      case 1.26117e-44:
        ScriptDepth = ScriptDepth + 1;
        break;
      case 1.4013e-44:
        ScriptDepth = ScriptDepth + -1;
        break;
      case 1.54143e-44:
        iVar2 = gl_ParseInt(sc);
        FLightDefaults::SetSubtractive(pFVar3,iVar2 != 0);
        break;
      case 1.82169e-44:
        iVar2 = gl_ParseInt(sc);
        FLightDefaults::SetHalo(pFVar3,iVar2 != 0);
        break;
      case 1.96182e-44:
        iVar2 = gl_ParseInt(sc);
        FLightDefaults::SetDontLightSelf(pFVar3,iVar2 != 0);
      }
    }
    gl_AddLightDefaults(pFStack_30);
  }
  else {
    FScanner::ScriptError(sc,"Expected \'{\'.\n");
  }
  return;
}

Assistant:

void gl_ParsePulseLight(FScanner &sc)
{
	int type;
	float floatVal, floatTriple[3];
	int intVal;
	FLightDefaults *defaults;

	// get name
	sc.GetString();
	FName name = sc.String;

	// check for opening brace
	sc.GetString();
	if (sc.Compare("{"))
	{
		defaults = new FLightDefaults(name, PulseLight);
		ScriptDepth++;
		while (ScriptDepth)
		{
			sc.GetString();
			type = sc.MatchString(LightTags);
			switch (type)
			{
			case LIGHTTAG_OPENBRACE:
				ScriptDepth++;
				break;
			case LIGHTTAG_CLOSEBRACE:
				ScriptDepth--;
				break;
			case LIGHTTAG_COLOR:
				gl_ParseTriple(sc, floatTriple);
				defaults->SetArg(LIGHT_RED, clamp<int>((int)(floatTriple[0] * 255), 0, 255));
				defaults->SetArg(LIGHT_GREEN, clamp<int>((int)(floatTriple[1] * 255), 0, 255));
				defaults->SetArg(LIGHT_BLUE, clamp<int>((int)(floatTriple[2] * 255), 0, 255));
				break;
			case LIGHTTAG_OFFSET:
				gl_ParseTriple(sc, floatTriple);
				defaults->SetOffset(floatTriple);
				break;
			case LIGHTTAG_SIZE:
				intVal = clamp<int>(gl_ParseInt(sc), 0, 255);
				defaults->SetArg(LIGHT_INTENSITY, intVal);
				break;
			case LIGHTTAG_SECSIZE:
				intVal = clamp<int>(gl_ParseInt(sc), 0, 255);
				defaults->SetArg(LIGHT_SECONDARY_INTENSITY, intVal);
				break;
			case LIGHTTAG_INTERVAL:
				floatVal = gl_ParseFloat(sc);
				defaults->SetParameter(floatVal * TICRATE);
				break;
			case LIGHTTAG_SUBTRACTIVE:
				defaults->SetSubtractive(gl_ParseInt(sc) != 0);
				break;
			case LIGHTTAG_HALO:
				defaults->SetHalo(gl_ParseInt(sc) != 0);
				break;
			case LIGHTTAG_DONTLIGHTSELF:
				defaults->SetDontLightSelf(gl_ParseInt(sc) != 0);
				break;
			default:
				sc.ScriptError("Unknown tag: %s\n", sc.String);
			}
		}
		gl_AddLightDefaults(defaults);
	}
	else
	{
		sc.ScriptError("Expected '{'.\n");
	}
}